

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O2

UniValue *
node::GetWarningsForRpc(UniValue *__return_storage_ptr__,Warnings *warnings,bool use_deprecated)

{
  string str;
  UniValue val;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  undefined1 auStack_e8 [16];
  vector<bilingual_str,_std::allocator<bilingual_str>_> all_messages;
  UniValue local_c0;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,use_deprecated) == 0) {
    local_68 = local_58;
    local_60 = 0;
    local_58[0] = 0;
    str.field_2._M_allocated_capacity =
         (size_type)
         all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
         super__Vector_impl_data._M_start;
    str._0_16_ = auStack_e8;
    str.field_2._8_8_ =
         all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
         super__Vector_impl_data._M_finish;
    UniValue::UniValue(__return_storage_ptr__,VARR,str);
    std::__cxx11::string::~string((string *)&local_68);
    Warnings::GetMessages
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_48,warnings);
    for (; local_48._M_dataplus._M_p != (pointer)local_48._M_string_length;
        local_48._M_dataplus._M_p = local_48._M_dataplus._M_p + 0x40) {
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._M_dataplus._M_p);
      val.val._M_string_length =
           (size_type)
           all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
           super__Vector_impl_data._M_start;
      val.typ = auStack_e8._0_4_;
      val._4_4_ = auStack_e8._4_4_;
      val.val._M_dataplus._M_p = (pointer)auStack_e8._8_8_;
      val.val.field_2._M_allocated_capacity =
           (size_type)
           all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val._32_56_ = stack0xffffffffffffff38;
      UniValue::push_back(__return_storage_ptr__,val);
      UniValue::~UniValue(&local_c0);
    }
    this = &local_48;
  }
  else {
    Warnings::GetMessages(&all_messages,warnings);
    if (all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
        super__Vector_impl_data._M_start ==
        all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"",(allocator<char> *)(auStack_e8 + 0xf));
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_48,
                 &all_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].original);
    }
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&all_messages;
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue GetWarningsForRpc(const Warnings& warnings, bool use_deprecated)
{
    if (use_deprecated) {
        const auto all_messages{warnings.GetMessages()};
        return all_messages.empty() ? "" : all_messages.back().original;
    }

    UniValue messages{UniValue::VARR};
    for (auto&& message : warnings.GetMessages()) {
        messages.push_back(std::move(message.original));
    }
    return messages;
}